

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmCore.c
# Opt level: O2

void Sfm_NtkPrint(Sfm_Ntk_t *p)

{
  char cVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  int iVar3;
  ulong uVar4;
  
  uVar4 = 0;
  while( true ) {
    if ((long)p->nObjs <= (long)uVar4) {
      return;
    }
    iVar3 = (int)uVar4;
    p_00 = Vec_WecEntry(&p->vFanins,iVar3);
    printf("Obj %3d : ",uVar4 & 0xffffffff);
    cVar1 = Vec_StrEntry(p->vFixed,iVar3);
    printf("Fixed %d  ",(ulong)(uint)(int)cVar1);
    cVar1 = Vec_StrEntry(p->vEmpty,iVar3);
    printf("Empty %d  ",(ulong)(uint)(int)cVar1);
    printf("Truth  ");
    if ((long)p->vTruths->nSize <= (long)uVar4) break;
    Extra_PrintHex(_stdout,(uint *)(p->vTruths->pArray + uVar4),p_00->nSize);
    printf("  ");
    printf("Vector has %d entries: {",(ulong)(uint)p_00->nSize);
    for (iVar3 = 0; iVar3 < p_00->nSize; iVar3 = iVar3 + 1) {
      uVar2 = Vec_IntEntry(p_00,iVar3);
      printf(" %d",(ulong)uVar2);
    }
    puts(" }");
    uVar4 = uVar4 + 1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
}

Assistant:

void Sfm_NtkPrint( Sfm_Ntk_t * p )
{
    int i;
    for ( i = 0; i < p->nObjs; i++ )
    {
        Vec_Int_t * vArray = Vec_WecEntry( &p->vFanins, i );
        printf( "Obj %3d : ", i );
        printf( "Fixed %d  ", Vec_StrEntry(p->vFixed, i) );
        printf( "Empty %d  ", Vec_StrEntry(p->vEmpty, i) );
        printf( "Truth  " );
        Extra_PrintHex( stdout, (unsigned *)Vec_WrdEntryP(p->vTruths, i), Vec_IntSize(vArray) );
        printf( "  " );
        Vec_IntPrint( vArray );
    }
}